

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void report_weapon_skill(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  int sn;
  int skill;
  CLogger *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  CHAR_DATA *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = is_npc(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    if (*(short *)&in_RSI[9]._M_str == 5) {
      if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 2) {
        iVar2 = (int)gsn_dagger;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 1) {
        iVar2 = (int)gsn_sword;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 4) {
        iVar2 = (int)gsn_mace;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 3) {
        iVar2 = (int)gsn_spear;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 5) {
        iVar2 = (int)gsn_axe;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 6) {
        iVar2 = (int)gsn_flail;
      }
      else if (*(int *)((long)&in_RSI[0x11]._M_str + 4) == 9) {
        iVar2 = (int)gsn_staff;
      }
      else {
        iVar2 = -1;
      }
      if (iVar2 == -1) {
        iVar3 = *(short *)(in_RDI + 0x138) * 3;
      }
      else {
        iVar3 = (int)*(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar2 * 2);
      }
      if (iVar3 < 100) {
        if (iVar3 < 0x56) {
          if (iVar3 < 0x47) {
            if (iVar3 < 0x33) {
              if (iVar3 < 0x1a) {
                if (iVar3 < 2) {
                  act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8,0);
                }
                else {
                  act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8,0);
                }
              }
              else {
                act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffd8,0);
              }
            }
            else {
              act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
                  in_stack_ffffffffffffffd8,0);
            }
          }
          else {
            act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
                in_stack_ffffffffffffffd8,0);
          }
        }
        else {
          act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
              in_stack_ffffffffffffffd8,0);
        }
      }
      else {
        act((char *)in_RSI,(CHAR_DATA *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffe0,
            in_stack_ffffffffffffffd8,0);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      CLogger::Debug<short&,short&,char*&>
                (in_stack_00000028,(string_view)in_stack_00000030,(short *)ch,(short *)obj,_sn);
    }
  }
  return;
}

Assistant:

void report_weapon_skill(CHAR_DATA *ch, OBJ_DATA *obj)
{
	int skill, sn;

	if (is_npc(ch))
		return;

	if (obj->item_type != ITEM_WEAPON)
	{
		RS.Logger.Debug("report_weapon_skill: Bad obj->type, {}, vnum {}, carried by {}.", 
			obj->item_type,
			obj->pIndexData->vnum,
			ch->name);
		return;
	}

	if (obj->value[0] == WEAPON_DAGGER)
		sn = gsn_dagger;
	else if (obj->value[0] == WEAPON_SWORD)
		sn = gsn_sword;
	else if (obj->value[0] == WEAPON_MACE)
		sn = gsn_mace;
	else if (obj->value[0] == WEAPON_SPEAR)
		sn = gsn_spear;
	else if (obj->value[0] == WEAPON_AXE)
		sn = gsn_axe;
	else if (obj->value[0] == WEAPON_FLAIL)
		sn = gsn_flail;
	else if (obj->value[0] == WEAPON_STAFF)
		sn = gsn_staff;
	else
		sn = -1;

	if (sn == -1)
		skill = ch->level * 3;
	else
		skill = ch->pcdata->learned[sn];

	if (skill >= 100)
		act("$p feels like a part of you!", ch, obj, nullptr, TO_CHAR);
	else if (skill > 85)
		act("You feel quite confident with $p.", ch, obj, 0, TO_CHAR);
	else if (skill > 70)
		act("You are skilled with $p.", ch, obj, 0, TO_CHAR);
	else if (skill > 50)
		act("Your skill with $p is adequate.", ch, obj, 0, TO_CHAR);
	else if (skill > 25)
		act("$p feels a little clumsy in your hands.", ch, obj, 0, TO_CHAR);
	else if (skill > 1)
		act("You fumble and almost drop $p.", ch, obj, 0, TO_CHAR);
	else
		act("You don't even know which end is up on $p.", ch, obj, 0, TO_CHAR);
}